

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  AccelData *pAVar4;
  Geometry *pGVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined4 in_EAX;
  uint uVar22;
  RayK<4> *pRVar23;
  int iVar24;
  RayK<4> *pRVar25;
  undefined8 uVar26;
  undefined4 uVar27;
  ulong uVar28;
  RayK<4> *pRVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  float fVar40;
  float fVar70;
  float fVar72;
  vint4 bi_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar71;
  uint uVar73;
  float fVar74;
  uint uVar75;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar76;
  uint uVar77;
  uint uVar78;
  float fVar84;
  float fVar87;
  vint4 ai;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  uint uVar85;
  uint uVar86;
  uint uVar88;
  uint uVar89;
  float fVar90;
  uint uVar91;
  uint uVar92;
  float fVar93;
  undefined1 auVar83 [16];
  uint uVar94;
  float fVar95;
  uint uVar106;
  float fVar107;
  uint uVar108;
  float fVar109;
  vint4 ai_1;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar110;
  float fVar111;
  float fVar112;
  float fVar117;
  float fVar118;
  vint4 ai_3;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  undefined1 auVar116 [16];
  float fVar120;
  float fVar121;
  float fVar122;
  vint4 bi_9;
  float fVar123;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar130;
  float fVar131;
  vint4 ai_5;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  undefined1 auVar129 [16];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar145;
  float fVar146;
  vint4 bi_4;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  vint4 bi_3;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  vint4 ai_4;
  float fVar155;
  StackItemMaskT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1268 [16];
  uint local_1238;
  uint uStack_1234;
  uint uStack_1230;
  uint uStack_122c;
  undefined1 local_1218 [16];
  undefined1 local_1208 [16];
  float local_11c8;
  float fStack_11c4;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  uint local_1138 [4];
  int local_1128;
  int iStack_1124;
  int iStack_1120;
  int iStack_111c;
  undefined1 local_1118 [16];
  undefined8 local_1108;
  undefined8 uStack_1100;
  undefined8 local_10f8;
  undefined8 uStack_10f0;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float local_10c8;
  float fStack_10c4;
  float fStack_10c0;
  float fStack_10bc;
  undefined8 local_10b8;
  undefined8 uStack_10b0;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  undefined1 local_fc8 [16];
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  ulong local_f78 [2];
  RayK<4> local_f68 [3896];
  
  local_1128 = (valid_i->field_0).i[0];
  iStack_1124 = (valid_i->field_0).i[1];
  iStack_1120 = (valid_i->field_0).i[2];
  iStack_111c = (valid_i->field_0).i[3];
  auVar79._0_4_ = -(uint)(local_1128 == -1);
  auVar79._4_4_ = -(uint)(iStack_1124 == -1);
  auVar79._8_4_ = -(uint)(iStack_1120 == -1);
  auVar79._12_4_ = -(uint)(iStack_111c == -1);
  uVar22 = movmskps(in_EAX,auVar79);
  if (uVar22 == 0) {
    return;
  }
  pAVar4 = This->ptr;
  uVar28 = (ulong)(uVar22 & 0xff);
  auVar69 = *(undefined1 (*) [16])ray;
  auVar2 = *(undefined1 (*) [16])(ray + 0x10);
  auVar3 = *(undefined1 (*) [16])(ray + 0x20);
  auVar81 = *(undefined1 (*) [16])(ray + 0x40);
  fVar120 = (float)DAT_01f4bd50;
  fVar121 = DAT_01f4bd50._4_4_;
  fVar122 = DAT_01f4bd50._8_4_;
  fVar123 = DAT_01f4bd50._12_4_;
  auVar82._4_4_ = -(uint)(ABS(auVar81._4_4_) < fVar121);
  auVar82._0_4_ = -(uint)(ABS(auVar81._0_4_) < fVar120);
  auVar82._8_4_ = -(uint)(ABS(auVar81._8_4_) < fVar122);
  auVar82._12_4_ = -(uint)(ABS(auVar81._12_4_) < fVar123);
  auVar124 = blendvps(auVar81,_DAT_01f4bd50,auVar82);
  auVar82 = *(undefined1 (*) [16])(ray + 0x50);
  auVar113._4_4_ = -(uint)(ABS(auVar82._4_4_) < fVar121);
  auVar113._0_4_ = -(uint)(ABS(auVar82._0_4_) < fVar120);
  auVar113._8_4_ = -(uint)(ABS(auVar82._8_4_) < fVar122);
  auVar113._12_4_ = -(uint)(ABS(auVar82._12_4_) < fVar123);
  auVar127 = blendvps(auVar82,_DAT_01f4bd50,auVar113);
  auVar113 = *(undefined1 (*) [16])(ray + 0x60);
  auVar41._4_4_ = -(uint)(ABS(auVar113._4_4_) < fVar121);
  auVar41._0_4_ = -(uint)(ABS(auVar113._0_4_) < fVar120);
  auVar41._8_4_ = -(uint)(ABS(auVar113._8_4_) < fVar122);
  auVar41._12_4_ = -(uint)(ABS(auVar113._12_4_) < fVar123);
  auVar142 = blendvps(auVar113,_DAT_01f4bd50,auVar41);
  auVar41 = rcpps(auVar41,auVar124);
  fVar120 = auVar41._0_4_;
  fVar123 = auVar41._4_4_;
  fVar136 = auVar41._8_4_;
  fVar137 = auVar41._12_4_;
  fVar120 = (1.0 - auVar124._0_4_ * fVar120) * fVar120 + fVar120;
  fVar123 = (1.0 - auVar124._4_4_ * fVar123) * fVar123 + fVar123;
  fVar136 = (1.0 - auVar124._8_4_ * fVar136) * fVar136 + fVar136;
  fVar137 = (1.0 - auVar124._12_4_ * fVar137) * fVar137 + fVar137;
  auVar41 = rcpps(auVar41,auVar127);
  fVar121 = auVar41._0_4_;
  fVar138 = auVar41._4_4_;
  fVar139 = auVar41._8_4_;
  fVar140 = auVar41._12_4_;
  fVar121 = (1.0 - auVar127._0_4_ * fVar121) * fVar121 + fVar121;
  fVar138 = (1.0 - auVar127._4_4_ * fVar138) * fVar138 + fVar138;
  fVar139 = (1.0 - auVar127._8_4_ * fVar139) * fVar139 + fVar139;
  fVar140 = (1.0 - auVar127._12_4_ * fVar140) * fVar140 + fVar140;
  auVar41 = rcpps(auVar41,auVar142);
  fVar122 = auVar41._0_4_;
  fVar133 = auVar41._4_4_;
  fVar134 = auVar41._8_4_;
  fVar135 = auVar41._12_4_;
  fVar122 = (1.0 - auVar142._0_4_ * fVar122) * fVar122 + fVar122;
  fVar133 = (1.0 - auVar142._4_4_ * fVar133) * fVar133 + fVar133;
  fVar134 = (1.0 - auVar142._8_4_ * fVar134) * fVar134 + fVar134;
  fVar135 = (1.0 - auVar142._12_4_ * fVar135) * fVar135 + fVar135;
  auVar124._0_12_ = ZEXT812(0);
  auVar124._12_4_ = 0;
  auVar41 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar124);
  local_1118 = maxps(*(undefined1 (*) [16])(ray + 0x80),auVar124);
  uVar32 = CONCAT44(auVar79._4_4_,auVar79._0_4_);
  local_1268._0_8_ = uVar32 ^ 0xffffffffffffffff;
  local_1268._8_4_ = auVar79._8_4_ ^ 0xffffffff;
  local_1268._12_4_ = auVar79._12_4_ ^ 0xffffffff;
  local_1138[0] =
       -(uint)(auVar113._0_4_ < 0.0) & 4 | auVar79._0_4_ ^ 0xffffffff |
       -(uint)(auVar82._0_4_ < 0.0) & 2 | -(uint)(auVar81._0_4_ < 0.0) & 1;
  local_1138[1] =
       -(uint)(auVar113._4_4_ < 0.0) & 4 | auVar79._4_4_ ^ 0xffffffff |
       -(uint)(auVar82._4_4_ < 0.0) & 2 | -(uint)(auVar81._4_4_ < 0.0) & 1;
  local_1138[2] =
       -(uint)(auVar113._8_4_ < 0.0) & 4 | auVar79._8_4_ ^ 0xffffffff |
       -(uint)(auVar82._8_4_ < 0.0) & 2 | -(uint)(auVar81._8_4_ < 0.0) & 1;
  local_1138[3] =
       -(uint)(auVar113._12_4_ < 0.0) & 4 | auVar79._12_4_ ^ 0xffffffff |
       -(uint)(auVar82._12_4_ < 0.0) & 2 | -(uint)(auVar81._12_4_ < 0.0) & 1;
  pRVar29 = ray;
LAB_006e8e55:
  lVar31 = 0;
  if (uVar28 != 0) {
    for (; (uVar28 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
    }
  }
  uVar22 = local_1138[lVar31];
  auVar42._0_8_ = CONCAT44(-(uint)(uVar22 == local_1138[1]),-(uint)(uVar22 == local_1138[0]));
  auVar42._8_4_ = -(uint)(uVar22 == local_1138[2]);
  auVar42._12_4_ = -(uint)(uVar22 == local_1138[3]);
  uVar27 = movmskps((int)pRVar29,auVar42);
  local_f78[1] = CONCAT44((int)((ulong)pRVar29 >> 0x20),uVar27);
  uVar26 = *(undefined8 *)&pAVar4[1].bounds.bounds0.lower.field_0;
  local_f78[0] = uVar26;
  uVar28 = ~local_f78[1] & uVar28;
  auVar79 = blendvps(_DAT_01f45a30,auVar69,auVar42);
  auVar96._4_4_ = auVar79._0_4_;
  auVar96._0_4_ = auVar79._4_4_;
  auVar96._8_4_ = auVar79._12_4_;
  auVar96._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar96,auVar79);
  auVar80._0_8_ = auVar79._8_8_;
  auVar80._8_4_ = auVar79._0_4_;
  auVar80._12_4_ = auVar79._4_4_;
  auVar81 = minps(auVar80,auVar79);
  local_1208._8_4_ = auVar42._8_4_;
  local_1208._0_8_ = auVar42._0_8_;
  local_1208._12_4_ = auVar42._12_4_;
  auVar79 = blendvps(_DAT_01f45a30,auVar2,auVar42);
  auVar43._4_4_ = auVar79._0_4_;
  auVar43._0_4_ = auVar79._4_4_;
  auVar43._8_4_ = auVar79._12_4_;
  auVar43._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar43,auVar79);
  auVar97._0_8_ = auVar79._8_8_;
  auVar97._8_4_ = auVar79._0_4_;
  auVar97._12_4_ = auVar79._4_4_;
  auVar79 = minps(auVar97,auVar79);
  auVar81 = insertps(auVar81,auVar79,0x1c);
  auVar44._8_4_ = auVar42._8_4_;
  auVar44._0_8_ = auVar42._0_8_;
  auVar44._12_4_ = auVar42._12_4_;
  auVar79 = blendvps(_DAT_01f45a30,auVar3,auVar44);
  auVar45._4_4_ = auVar79._0_4_;
  auVar45._0_4_ = auVar79._4_4_;
  auVar45._8_4_ = auVar79._12_4_;
  auVar45._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar45,auVar79);
  auVar98._0_8_ = auVar79._8_8_;
  auVar98._8_4_ = auVar79._0_4_;
  auVar98._12_4_ = auVar79._4_4_;
  auVar79 = minps(auVar98,auVar79);
  auVar82 = insertps(auVar81,auVar79,0x20);
  auVar46._8_4_ = auVar42._8_4_;
  auVar46._0_8_ = auVar42._0_8_;
  auVar46._12_4_ = auVar42._12_4_;
  auVar79 = blendvps(_DAT_01f45a40,auVar69,auVar46);
  auVar47._4_4_ = auVar79._0_4_;
  auVar47._0_4_ = auVar79._4_4_;
  auVar47._8_4_ = auVar79._12_4_;
  auVar47._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar47,auVar79);
  auVar99._0_8_ = auVar79._8_8_;
  auVar99._8_4_ = auVar79._0_4_;
  auVar99._12_4_ = auVar79._4_4_;
  auVar81 = maxps(auVar99,auVar79);
  auVar48._8_4_ = auVar42._8_4_;
  auVar48._0_8_ = auVar42._0_8_;
  auVar48._12_4_ = auVar42._12_4_;
  auVar79 = blendvps(_DAT_01f45a40,auVar2,auVar48);
  auVar49._4_4_ = auVar79._0_4_;
  auVar49._0_4_ = auVar79._4_4_;
  auVar49._8_4_ = auVar79._12_4_;
  auVar49._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar49,auVar79);
  auVar100._0_8_ = auVar79._8_8_;
  auVar100._8_4_ = auVar79._0_4_;
  auVar100._12_4_ = auVar79._4_4_;
  auVar79 = maxps(auVar100,auVar79);
  auVar81 = insertps(auVar81,auVar79,0x1c);
  auVar50._8_4_ = auVar42._8_4_;
  auVar50._0_8_ = auVar42._0_8_;
  auVar50._12_4_ = auVar42._12_4_;
  auVar79 = blendvps(_DAT_01f45a40,auVar3,auVar50);
  auVar51._4_4_ = auVar79._0_4_;
  auVar51._0_4_ = auVar79._4_4_;
  auVar51._8_4_ = auVar79._12_4_;
  auVar51._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar51,auVar79);
  auVar101._0_8_ = auVar79._8_8_;
  auVar101._8_4_ = auVar79._0_4_;
  auVar101._12_4_ = auVar79._4_4_;
  auVar79 = maxps(auVar101,auVar79);
  auVar113 = insertps(auVar81,auVar79,0x20);
  auVar52._8_4_ = auVar42._8_4_;
  auVar52._0_8_ = auVar42._0_8_;
  auVar52._12_4_ = auVar42._12_4_;
  auVar142._4_4_ = fVar123;
  auVar142._0_4_ = fVar120;
  auVar142._8_4_ = fVar136;
  auVar142._12_4_ = fVar137;
  auVar79 = blendvps(_DAT_01f45a30,auVar142,auVar52);
  auVar53._4_4_ = auVar79._0_4_;
  auVar53._0_4_ = auVar79._4_4_;
  auVar53._8_4_ = auVar79._12_4_;
  auVar53._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar53,auVar79);
  auVar128._0_8_ = auVar79._8_8_;
  auVar128._8_4_ = auVar79._0_4_;
  auVar128._12_4_ = auVar79._4_4_;
  auVar81 = minps(auVar128,auVar79);
  auVar54._8_4_ = auVar42._8_4_;
  auVar54._0_8_ = auVar42._0_8_;
  auVar54._12_4_ = auVar42._12_4_;
  auVar6._4_4_ = fVar138;
  auVar6._0_4_ = fVar121;
  auVar6._8_4_ = fVar139;
  auVar6._12_4_ = fVar140;
  auVar79 = blendvps(_DAT_01f45a30,auVar6,auVar54);
  auVar55._4_4_ = auVar79._0_4_;
  auVar55._0_4_ = auVar79._4_4_;
  auVar55._8_4_ = auVar79._12_4_;
  auVar55._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar55,auVar79);
  auVar102._0_8_ = auVar79._8_8_;
  auVar102._8_4_ = auVar79._0_4_;
  auVar102._12_4_ = auVar79._4_4_;
  auVar79 = minps(auVar102,auVar79);
  auVar124 = insertps(auVar81,auVar79,0x1c);
  auVar56._8_4_ = auVar42._8_4_;
  auVar56._0_8_ = auVar42._0_8_;
  auVar56._12_4_ = auVar42._12_4_;
  auVar81._4_4_ = fVar133;
  auVar81._0_4_ = fVar122;
  auVar81._8_4_ = fVar134;
  auVar81._12_4_ = fVar135;
  auVar79 = blendvps(_DAT_01f45a30,auVar81,auVar56);
  auVar57._4_4_ = auVar79._0_4_;
  auVar57._0_4_ = auVar79._4_4_;
  auVar57._8_4_ = auVar79._12_4_;
  auVar57._12_4_ = auVar79._8_4_;
  auVar79 = minps(auVar57,auVar79);
  auVar103._0_8_ = auVar79._8_8_;
  auVar103._8_4_ = auVar79._0_4_;
  auVar103._12_4_ = auVar79._4_4_;
  auVar79 = minps(auVar103,auVar79);
  auVar142 = insertps(auVar124,auVar79,0x20);
  auVar58._8_4_ = auVar42._8_4_;
  auVar58._0_8_ = auVar42._0_8_;
  auVar58._12_4_ = auVar42._12_4_;
  auVar148._4_4_ = fVar123;
  auVar148._0_4_ = fVar120;
  auVar148._8_4_ = fVar136;
  auVar148._12_4_ = fVar137;
  auVar79 = blendvps(_DAT_01f45a40,auVar148,auVar58);
  auVar59._4_4_ = auVar79._0_4_;
  auVar59._0_4_ = auVar79._4_4_;
  auVar59._8_4_ = auVar79._12_4_;
  auVar59._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar59,auVar79);
  auVar125._0_8_ = auVar79._8_8_;
  auVar125._8_4_ = auVar79._0_4_;
  auVar125._12_4_ = auVar79._4_4_;
  auVar81 = maxps(auVar125,auVar79);
  auVar60._8_4_ = auVar42._8_4_;
  auVar60._0_8_ = auVar42._0_8_;
  auVar60._12_4_ = auVar42._12_4_;
  auVar7._4_4_ = fVar138;
  auVar7._0_4_ = fVar121;
  auVar7._8_4_ = fVar139;
  auVar7._12_4_ = fVar140;
  auVar79 = blendvps(_DAT_01f45a40,auVar7,auVar60);
  auVar104._4_4_ = auVar79._0_4_;
  auVar104._0_4_ = auVar79._4_4_;
  auVar104._8_4_ = auVar79._12_4_;
  auVar104._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar104,auVar79);
  auVar114._0_8_ = auVar79._8_8_;
  auVar114._8_4_ = auVar79._0_4_;
  auVar114._12_4_ = auVar79._4_4_;
  auVar79 = maxps(auVar114,auVar79);
  auVar81 = insertps(auVar81,auVar79,0x1c);
  auVar127._4_4_ = fVar133;
  auVar127._0_4_ = fVar122;
  auVar127._8_4_ = fVar134;
  auVar127._12_4_ = fVar135;
  auVar79 = blendvps(_DAT_01f45a40,auVar127,auVar60);
  auVar105._4_4_ = auVar79._0_4_;
  auVar105._0_4_ = auVar79._4_4_;
  auVar105._8_4_ = auVar79._12_4_;
  auVar105._12_4_ = auVar79._8_4_;
  auVar79 = maxps(auVar105,auVar79);
  auVar115._0_8_ = auVar79._8_8_;
  auVar115._8_4_ = auVar79._0_4_;
  auVar115._12_4_ = auVar79._4_4_;
  auVar79 = maxps(auVar115,auVar79);
  auVar127 = insertps(auVar81,auVar79,0x20);
  auVar79 = blendvps(_DAT_01f45a30,auVar41,auVar60);
  auVar147._4_4_ = auVar79._0_4_;
  auVar147._0_4_ = auVar79._4_4_;
  auVar147._8_4_ = auVar79._12_4_;
  auVar147._12_4_ = auVar79._8_4_;
  auVar124 = blendvps(_DAT_01f45a40,local_1118,auVar60);
  auVar148 = minps(auVar147,auVar79);
  auVar61._4_4_ = -(uint)(0.0 <= auVar142._4_4_);
  auVar61._0_4_ = -(uint)(0.0 <= auVar142._0_4_);
  auVar61._8_4_ = -(uint)(0.0 <= auVar142._8_4_);
  auVar61._12_4_ = -(uint)(0.0 <= auVar142._12_4_);
  auVar79 = blendvps(auVar127,auVar142,auVar61);
  auVar81 = blendvps(auVar82,auVar113,auVar61);
  auVar113 = blendvps(auVar113,auVar82,auVar61);
  local_fd8 = auVar79._0_4_;
  local_ff8 = auVar79._4_4_;
  auVar143._4_4_ = auVar124._0_4_;
  auVar143._0_4_ = auVar124._4_4_;
  auVar143._8_4_ = auVar124._12_4_;
  auVar143._12_4_ = auVar124._8_4_;
  uVar39 = (ulong)(local_ff8 < 0.0) << 4 | 0x20;
  local_fb8 = auVar79._8_4_;
  auVar82 = maxps(auVar143,auVar124);
  uVar32 = (ulong)(local_fb8 < 0.0) << 4 | 0x40;
  auVar79 = blendvps(auVar142,auVar127,auVar61);
  local_fe8 = auVar81._0_4_ * local_fd8;
  local_1008 = auVar81._4_4_ * local_ff8;
  local_fc8._8_4_ = auVar81._8_4_ * local_fb8;
  local_11b8 = auVar113._0_4_;
  fStack_11b4 = auVar113._4_4_;
  fStack_11b0 = auVar113._8_4_;
  local_1018 = auVar79._0_4_;
  local_1028 = local_11b8 * local_1018;
  local_1038 = auVar79._4_4_;
  local_1048 = fStack_11b4 * local_1038;
  local_f88._8_4_ = auVar79._8_4_;
  fStack_11b0 = fStack_11b0 * local_f88._8_4_;
  uVar38 = (ulong)(local_fd8 < 0.0) * 0x10;
  fStack_fd4 = local_fd8;
  fStack_fd0 = local_fd8;
  fStack_fcc = local_fd8;
  fStack_fe4 = local_fe8;
  fStack_fe0 = local_fe8;
  fStack_fdc = local_fe8;
  fStack_ff4 = local_ff8;
  fStack_ff0 = local_ff8;
  fStack_fec = local_ff8;
  fStack_1004 = local_1008;
  fStack_1000 = local_1008;
  fStack_ffc = local_1008;
  fStack_fb4 = local_fb8;
  fStack_fb0 = local_fb8;
  fStack_fac = local_fb8;
  local_fc8._4_4_ = local_fc8._8_4_;
  local_fc8._0_4_ = local_fc8._8_4_;
  local_fc8._12_4_ = local_fc8._8_4_;
  fStack_1014 = local_1018;
  fStack_1010 = local_1018;
  fStack_100c = local_1018;
  auVar79 = blendvps(_DAT_01f45a30,auVar41,local_1208);
  fStack_1024 = local_1028;
  fStack_1020 = local_1028;
  fStack_101c = local_1028;
  uVar27 = auVar148._0_4_;
  auVar149._8_4_ = auVar148._8_4_;
  auVar62._4_4_ = uVar27;
  auVar62._0_4_ = uVar27;
  auVar62._8_4_ = uVar27;
  auVar62._12_4_ = uVar27;
  auVar149._4_4_ = auVar149._8_4_;
  auVar149._0_4_ = auVar149._8_4_;
  auVar149._12_4_ = auVar149._8_4_;
  local_f98 = minps(auVar149,auVar62);
  uVar27 = auVar82._0_4_;
  auVar144._8_4_ = auVar82._8_4_;
  auVar63._4_4_ = uVar27;
  auVar63._0_4_ = uVar27;
  auVar63._8_4_ = uVar27;
  auVar63._12_4_ = uVar27;
  auVar144._4_4_ = auVar144._8_4_;
  auVar144._0_4_ = auVar144._8_4_;
  auVar144._12_4_ = auVar144._8_4_;
  local_fa8 = maxps(auVar144,auVar63);
  fStack_1034 = local_1038;
  fStack_1030 = local_1038;
  fStack_102c = local_1038;
  fStack_1044 = local_1048;
  fStack_1040 = local_1048;
  fStack_103c = local_1048;
  local_f88._4_4_ = local_f88._8_4_;
  local_f88._0_4_ = local_f88._8_4_;
  local_f88._12_4_ = local_f88._8_4_;
  pRVar23 = local_f68;
LAB_006e9246:
  uVar27 = movmskps((int)uVar26,local_1268);
  pRVar25 = pRVar23;
  do {
    pRVar29 = (RayK<4> *)local_f78;
    if (pRVar25 == pRVar29) goto LAB_006e991e;
    pRVar23 = pRVar25 + -0x10;
    pRVar29 = pRVar25 + -8;
    pRVar25 = pRVar23;
    if ((*(ulong *)pRVar29 & ~CONCAT44((int)((ulong)uVar26 >> 0x20),uVar27)) != 0) {
      uVar33 = 1;
      pRVar29 = pRVar23;
      uVar30 = *(ulong *)pRVar23;
      do {
        pRVar25 = pRVar23;
        if ((uVar30 & 8) != 0) {
          if (uVar33 != 0) {
            local_1218._0_8_ = local_1268._0_8_ ^ 0xffffffffffffffff;
            local_1218._8_4_ = local_1268._8_4_ ^ 0xffffffff;
            local_1218._12_4_ = local_1268._12_4_ ^ 0xffffffff;
            uVar26 = *(undefined8 *)ray;
            uVar8 = *(undefined8 *)(ray + 8);
            local_1078 = uVar26;
            uStack_1070 = uVar8;
            uVar9 = *(undefined8 *)(ray + 0x10);
            uVar10 = *(undefined8 *)(ray + 0x18);
            local_1088 = uVar9;
            uStack_1080 = uVar10;
            uVar11 = *(undefined8 *)(ray + 0x20);
            uVar12 = *(undefined8 *)(ray + 0x28);
            local_1098 = uVar11;
            uStack_1090 = uVar12;
            uVar13 = *(undefined8 *)(ray + 0x30);
            uVar14 = *(undefined8 *)(ray + 0x38);
            local_10f8 = uVar13;
            uStack_10f0 = uVar14;
            uVar15 = *(undefined8 *)(ray + 0x40);
            uVar16 = *(undefined8 *)(ray + 0x48);
            local_10a8 = uVar15;
            uStack_10a0 = uVar16;
            uVar17 = *(undefined8 *)(ray + 0x80);
            uVar18 = *(undefined8 *)(ray + 0x88);
            local_1108 = uVar17;
            uStack_1100 = uVar18;
            uVar19 = *(undefined8 *)(ray + 0x90);
            uVar20 = *(undefined8 *)(ray + 0x98);
            local_10b8 = uVar19;
            uStack_10b0 = uVar20;
            lVar31 = (uVar30 & 0xfffffffffffffff0) + 0x90;
            lVar34 = 0;
            pRVar25 = ray;
            goto LAB_006e950b;
          }
          break;
        }
        pfVar1 = (float *)(uVar30 + 0x20 + uVar38);
        fVar40 = *pfVar1 * local_fd8 - local_fe8;
        fVar70 = pfVar1[1] * local_fd8 - local_fe8;
        fVar72 = pfVar1[2] * local_fd8 - local_fe8;
        fVar74 = pfVar1[3] * local_fd8 - local_fe8;
        pfVar1 = (float *)(uVar30 + 0x20 + uVar39);
        fVar76 = *pfVar1 * local_ff8 - local_1008;
        fVar84 = pfVar1[1] * local_ff8 - local_1008;
        fVar87 = pfVar1[2] * local_ff8 - local_1008;
        fVar90 = pfVar1[3] * local_ff8 - local_1008;
        uVar77 = (uint)((int)fVar76 < (int)fVar40) * (int)fVar40 |
                 (uint)((int)fVar76 >= (int)fVar40) * (int)fVar76;
        uVar85 = (uint)((int)fVar84 < (int)fVar70) * (int)fVar70 |
                 (uint)((int)fVar84 >= (int)fVar70) * (int)fVar84;
        uVar88 = (uint)((int)fVar87 < (int)fVar72) * (int)fVar72 |
                 (uint)((int)fVar87 >= (int)fVar72) * (int)fVar87;
        uVar91 = (uint)((int)fVar90 < (int)fVar74) * (int)fVar74 |
                 (uint)((int)fVar90 >= (int)fVar74) * (int)fVar90;
        pfVar1 = (float *)(uVar30 + 0x20 + uVar32);
        fVar40 = *pfVar1 * local_fb8 - local_fc8._8_4_;
        fVar70 = pfVar1[1] * local_fb8 - local_fc8._8_4_;
        fVar72 = pfVar1[2] * local_fb8 - local_fc8._8_4_;
        fVar74 = pfVar1[3] * local_fb8 - local_fc8._8_4_;
        uVar22 = (uint)((int)fVar40 < (int)local_f98._0_4_) * local_f98._0_4_ |
                 (uint)((int)fVar40 >= (int)local_f98._0_4_) * (int)fVar40;
        uVar71 = (uint)((int)fVar70 < (int)local_f98._4_4_) * local_f98._4_4_ |
                 (uint)((int)fVar70 >= (int)local_f98._4_4_) * (int)fVar70;
        uVar73 = (uint)((int)fVar72 < (int)local_f98._8_4_) * local_f98._8_4_ |
                 (uint)((int)fVar72 >= (int)local_f98._8_4_) * (int)fVar72;
        uVar75 = (uint)((int)fVar74 < (int)local_f98._12_4_) * local_f98._12_4_ |
                 (uint)((int)fVar74 >= (int)local_f98._12_4_) * (int)fVar74;
        pfVar1 = (float *)(uVar30 + 0x20 + (uVar38 ^ 0x10));
        fVar40 = *pfVar1 * local_1018 - local_1028;
        fVar70 = pfVar1[1] * local_1018 - local_1028;
        fVar72 = pfVar1[2] * local_1018 - local_1028;
        fVar74 = pfVar1[3] * local_1018 - local_1028;
        pfVar1 = (float *)(uVar30 + 0x20 + (uVar39 ^ 0x10));
        fVar76 = *pfVar1 * local_1038 - local_1048;
        fVar84 = pfVar1[1] * local_1038 - local_1048;
        fVar87 = pfVar1[2] * local_1038 - local_1048;
        fVar90 = pfVar1[3] * local_1038 - local_1048;
        uVar94 = (uint)((int)fVar40 < (int)fVar76) * (int)fVar40 |
                 (uint)((int)fVar40 >= (int)fVar76) * (int)fVar76;
        uVar106 = (uint)((int)fVar70 < (int)fVar84) * (int)fVar70 |
                  (uint)((int)fVar70 >= (int)fVar84) * (int)fVar84;
        uVar108 = (uint)((int)fVar72 < (int)fVar87) * (int)fVar72 |
                  (uint)((int)fVar72 >= (int)fVar87) * (int)fVar87;
        uVar110 = (uint)((int)fVar74 < (int)fVar90) * (int)fVar74 |
                  (uint)((int)fVar74 >= (int)fVar90) * (int)fVar90;
        pfVar1 = (float *)(uVar30 + 0x20 + (uVar32 ^ 0x10));
        fVar40 = *pfVar1 * local_f88._8_4_ - fStack_11b0;
        fVar70 = pfVar1[1] * local_f88._8_4_ - fStack_11b0;
        fVar72 = pfVar1[2] * local_f88._8_4_ - fStack_11b0;
        fVar74 = pfVar1[3] * local_f88._8_4_ - fStack_11b0;
        uVar78 = (uint)((int)local_fa8._0_4_ < (int)fVar40) * local_fa8._0_4_ |
                 (uint)((int)local_fa8._0_4_ >= (int)fVar40) * (int)fVar40;
        uVar86 = (uint)((int)local_fa8._4_4_ < (int)fVar70) * local_fa8._4_4_ |
                 (uint)((int)local_fa8._4_4_ >= (int)fVar70) * (int)fVar70;
        uVar89 = (uint)((int)local_fa8._8_4_ < (int)fVar72) * local_fa8._8_4_ |
                 (uint)((int)local_fa8._8_4_ >= (int)fVar72) * (int)fVar72;
        uVar92 = (uint)((int)local_fa8._12_4_ < (int)fVar74) * local_fa8._12_4_ |
                 (uint)((int)local_fa8._12_4_ >= (int)fVar74) * (int)fVar74;
        auVar64._4_4_ =
             -(uint)((float)(((int)uVar71 < (int)uVar85) * uVar85 |
                            ((int)uVar71 >= (int)uVar85) * uVar71) <=
                    (float)(((int)uVar106 < (int)uVar86) * uVar106 |
                           ((int)uVar106 >= (int)uVar86) * uVar86));
        auVar64._0_4_ =
             -(uint)((float)(((int)uVar22 < (int)uVar77) * uVar77 |
                            ((int)uVar22 >= (int)uVar77) * uVar22) <=
                    (float)(((int)uVar94 < (int)uVar78) * uVar94 |
                           ((int)uVar94 >= (int)uVar78) * uVar78));
        auVar64._8_4_ =
             -(uint)((float)(((int)uVar73 < (int)uVar88) * uVar88 |
                            ((int)uVar73 >= (int)uVar88) * uVar73) <=
                    (float)(((int)uVar108 < (int)uVar89) * uVar108 |
                           ((int)uVar108 >= (int)uVar89) * uVar89));
        auVar64._12_4_ =
             -(uint)((float)(((int)uVar75 < (int)uVar91) * uVar91 |
                            ((int)uVar75 >= (int)uVar91) * uVar75) <=
                    (float)(((int)uVar110 < (int)uVar92) * uVar110 |
                           ((int)uVar110 >= (int)uVar92) * uVar92));
        uVar22 = movmskps((int)pRVar29,auVar64);
        pRVar29 = (RayK<4> *)(ulong)uVar22;
        if (uVar22 == 0) break;
        uVar35 = (ulong)(byte)uVar22;
        uVar33 = 0;
        uVar36 = 8;
        do {
          lVar31 = 0;
          if (uVar35 != 0) {
            for (; (uVar35 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
            }
          }
          fVar40 = *(float *)(uVar30 + 0x20 + lVar31 * 4);
          fVar70 = *(float *)(uVar30 + 0x30 + lVar31 * 4);
          fVar72 = *(float *)(uVar30 + 0x40 + lVar31 * 4);
          fVar74 = *(float *)(uVar30 + 0x50 + lVar31 * 4);
          fVar95 = (fVar40 - auVar69._0_4_) * fVar120;
          fVar107 = (fVar40 - auVar69._4_4_) * fVar123;
          fVar109 = (fVar40 - auVar69._8_4_) * fVar136;
          fVar111 = (fVar40 - auVar69._12_4_) * fVar137;
          fVar112 = (fVar72 - auVar2._0_4_) * fVar121;
          fVar117 = (fVar72 - auVar2._4_4_) * fVar138;
          fVar118 = (fVar72 - auVar2._8_4_) * fVar139;
          fVar119 = (fVar72 - auVar2._12_4_) * fVar140;
          fVar40 = *(float *)(uVar30 + 0x60 + lVar31 * 4);
          fVar126 = (fVar40 - auVar3._0_4_) * fVar122;
          fVar130 = (fVar40 - auVar3._4_4_) * fVar133;
          fVar131 = (fVar40 - auVar3._8_4_) * fVar134;
          fVar132 = (fVar40 - auVar3._12_4_) * fVar135;
          fVar84 = (fVar70 - auVar69._0_4_) * fVar120;
          fVar87 = (fVar70 - auVar69._4_4_) * fVar123;
          fVar90 = (fVar70 - auVar69._8_4_) * fVar136;
          fVar93 = (fVar70 - auVar69._12_4_) * fVar137;
          fVar70 = (fVar74 - auVar2._0_4_) * fVar121;
          fVar72 = (fVar74 - auVar2._4_4_) * fVar138;
          fVar76 = (fVar74 - auVar2._8_4_) * fVar139;
          fVar74 = (fVar74 - auVar2._12_4_) * fVar140;
          fVar40 = *(float *)(uVar30 + 0x70 + lVar31 * 4);
          fVar141 = (fVar40 - auVar3._0_4_) * fVar122;
          fVar145 = (fVar40 - auVar3._4_4_) * fVar133;
          fVar146 = (fVar40 - auVar3._8_4_) * fVar134;
          fVar40 = (fVar40 - auVar3._12_4_) * fVar135;
          uVar22 = (uint)((int)fVar84 < (int)fVar95) * (int)fVar84 |
                   (uint)((int)fVar84 >= (int)fVar95) * (int)fVar95;
          uVar71 = (uint)((int)fVar87 < (int)fVar107) * (int)fVar87 |
                   (uint)((int)fVar87 >= (int)fVar107) * (int)fVar107;
          uVar73 = (uint)((int)fVar90 < (int)fVar109) * (int)fVar90 |
                   (uint)((int)fVar90 >= (int)fVar109) * (int)fVar109;
          uVar75 = (uint)((int)fVar93 < (int)fVar111) * (int)fVar93 |
                   (uint)((int)fVar93 >= (int)fVar111) * (int)fVar111;
          uVar77 = (uint)((int)fVar70 < (int)fVar112) * (int)fVar70 |
                   (uint)((int)fVar70 >= (int)fVar112) * (int)fVar112;
          uVar78 = (uint)((int)fVar72 < (int)fVar117) * (int)fVar72 |
                   (uint)((int)fVar72 >= (int)fVar117) * (int)fVar117;
          uVar85 = (uint)((int)fVar76 < (int)fVar118) * (int)fVar76 |
                   (uint)((int)fVar76 >= (int)fVar118) * (int)fVar118;
          uVar86 = (uint)((int)fVar74 < (int)fVar119) * (int)fVar74 |
                   (uint)((int)fVar74 >= (int)fVar119) * (int)fVar119;
          uVar94 = ((int)uVar77 < (int)uVar22) * uVar22 | ((int)uVar77 >= (int)uVar22) * uVar77;
          uVar106 = ((int)uVar78 < (int)uVar71) * uVar71 | ((int)uVar78 >= (int)uVar71) * uVar78;
          uVar108 = ((int)uVar85 < (int)uVar73) * uVar73 | ((int)uVar85 >= (int)uVar73) * uVar85;
          uVar110 = ((int)uVar86 < (int)uVar75) * uVar75 | ((int)uVar86 >= (int)uVar75) * uVar86;
          uVar22 = (uint)((int)fVar141 < (int)fVar126) * (int)fVar141 |
                   (uint)((int)fVar141 >= (int)fVar126) * (int)fVar126;
          uVar71 = (uint)((int)fVar145 < (int)fVar130) * (int)fVar145 |
                   (uint)((int)fVar145 >= (int)fVar130) * (int)fVar130;
          uVar73 = (uint)((int)fVar146 < (int)fVar131) * (int)fVar146 |
                   (uint)((int)fVar146 >= (int)fVar131) * (int)fVar131;
          uVar75 = (uint)((int)fVar40 < (int)fVar132) * (int)fVar40 |
                   (uint)((int)fVar40 >= (int)fVar132) * (int)fVar132;
          iVar24 = auVar79._0_4_;
          uVar88 = (uint)((int)uVar22 < iVar24) * iVar24 | ((int)uVar22 >= iVar24) * uVar22;
          iVar24 = auVar79._4_4_;
          uVar89 = (uint)((int)uVar71 < iVar24) * iVar24 | ((int)uVar71 >= iVar24) * uVar71;
          iVar24 = auVar79._8_4_;
          uVar91 = (uint)((int)uVar73 < iVar24) * iVar24 | ((int)uVar73 >= iVar24) * uVar73;
          iVar24 = auVar79._12_4_;
          uVar92 = (uint)((int)uVar75 < iVar24) * iVar24 | ((int)uVar75 >= iVar24) * uVar75;
          uVar77 = (uint)((int)fVar84 < (int)fVar95) * (int)fVar95 |
                   (uint)((int)fVar84 >= (int)fVar95) * (int)fVar84;
          uVar78 = (uint)((int)fVar87 < (int)fVar107) * (int)fVar107 |
                   (uint)((int)fVar87 >= (int)fVar107) * (int)fVar87;
          uVar85 = (uint)((int)fVar90 < (int)fVar109) * (int)fVar109 |
                   (uint)((int)fVar90 >= (int)fVar109) * (int)fVar90;
          uVar86 = (uint)((int)fVar93 < (int)fVar111) * (int)fVar111 |
                   (uint)((int)fVar93 >= (int)fVar111) * (int)fVar93;
          uVar22 = (uint)((int)fVar70 < (int)fVar112) * (int)fVar112 |
                   (uint)((int)fVar70 >= (int)fVar112) * (int)fVar70;
          uVar71 = (uint)((int)fVar72 < (int)fVar117) * (int)fVar117 |
                   (uint)((int)fVar72 >= (int)fVar117) * (int)fVar72;
          uVar73 = (uint)((int)fVar76 < (int)fVar118) * (int)fVar118 |
                   (uint)((int)fVar76 >= (int)fVar118) * (int)fVar76;
          uVar75 = (uint)((int)fVar74 < (int)fVar119) * (int)fVar119 |
                   (uint)((int)fVar74 >= (int)fVar119) * (int)fVar74;
          uVar22 = ((int)uVar77 < (int)uVar22) * uVar77 | ((int)uVar77 >= (int)uVar22) * uVar22;
          uVar71 = ((int)uVar78 < (int)uVar71) * uVar78 | ((int)uVar78 >= (int)uVar71) * uVar71;
          uVar73 = ((int)uVar85 < (int)uVar73) * uVar85 | ((int)uVar85 >= (int)uVar73) * uVar73;
          uVar75 = ((int)uVar86 < (int)uVar75) * uVar86 | ((int)uVar86 >= (int)uVar75) * uVar75;
          uVar77 = (uint)((int)fVar141 < (int)fVar126) * (int)fVar126 |
                   (uint)((int)fVar141 >= (int)fVar126) * (int)fVar141;
          uVar78 = (uint)((int)fVar145 < (int)fVar130) * (int)fVar130 |
                   (uint)((int)fVar145 >= (int)fVar130) * (int)fVar145;
          uVar85 = (uint)((int)fVar146 < (int)fVar131) * (int)fVar131 |
                   (uint)((int)fVar146 >= (int)fVar131) * (int)fVar146;
          uVar86 = (uint)((int)fVar40 < (int)fVar132) * (int)fVar132 |
                   (uint)((int)fVar40 >= (int)fVar132) * (int)fVar40;
          iVar24 = auVar124._0_4_;
          uVar77 = (uint)(iVar24 < (int)uVar77) * iVar24 | (iVar24 >= (int)uVar77) * uVar77;
          iVar24 = auVar124._4_4_;
          uVar78 = (uint)(iVar24 < (int)uVar78) * iVar24 | (iVar24 >= (int)uVar78) * uVar78;
          iVar24 = auVar124._8_4_;
          uVar85 = (uint)(iVar24 < (int)uVar85) * iVar24 | (iVar24 >= (int)uVar85) * uVar85;
          iVar24 = auVar124._12_4_;
          uVar86 = (uint)(iVar24 < (int)uVar86) * iVar24 | (iVar24 >= (int)uVar86) * uVar86;
          auVar150._4_4_ =
               -(uint)((float)(((int)uVar89 < (int)uVar106) * uVar106 |
                              ((int)uVar89 >= (int)uVar106) * uVar89) <=
                      (float)(((int)uVar71 < (int)uVar78) * uVar71 |
                             ((int)uVar71 >= (int)uVar78) * uVar78));
          auVar150._0_4_ =
               -(uint)((float)(((int)uVar88 < (int)uVar94) * uVar94 |
                              ((int)uVar88 >= (int)uVar94) * uVar88) <=
                      (float)(((int)uVar22 < (int)uVar77) * uVar22 |
                             ((int)uVar22 >= (int)uVar77) * uVar77));
          auVar150._8_4_ =
               -(uint)((float)(((int)uVar91 < (int)uVar108) * uVar108 |
                              ((int)uVar91 >= (int)uVar108) * uVar91) <=
                      (float)(((int)uVar73 < (int)uVar85) * uVar73 |
                             ((int)uVar73 >= (int)uVar85) * uVar85));
          auVar150._12_4_ =
               -(uint)((float)(((int)uVar92 < (int)uVar110) * uVar110 |
                              ((int)uVar92 >= (int)uVar110) * uVar92) <=
                      (float)(((int)uVar75 < (int)uVar86) * uVar75 |
                             ((int)uVar75 >= (int)uVar86) * uVar86));
          uVar22 = movmskps((int)pRVar29,auVar150);
          uVar37 = uVar36;
          if (uVar22 != 0) {
            uVar37 = *(ulong *)(uVar30 + lVar31 * 8);
            if (uVar36 != 8) {
              *(ulong *)pRVar23 = uVar36;
              *(ulong *)(pRVar23 + 8) = uVar33;
              pRVar23 = pRVar23 + 0x10;
            }
            uVar33 = (ulong)(uVar22 & 0xff);
          }
          pRVar29 = (RayK<4> *)(uVar35 - 1);
          uVar35 = uVar35 & (ulong)pRVar29;
          uVar36 = uVar37;
        } while (uVar35 != 0);
        pRVar25 = pRVar23;
        uVar30 = uVar37;
      } while (uVar37 != 8);
    }
  } while( true );
LAB_006e950b:
  do {
    if (lVar34 == (ulong)((uint)uVar30 & 0xf) - 8) break;
    pRVar29 = (RayK<4> *)&DAT_fffffffffffffff0;
    local_1238 = local_1218._0_4_;
    uVar22 = local_1238;
    uStack_1234 = local_1218._4_4_;
    uVar71 = uStack_1234;
    uStack_1230 = local_1218._8_4_;
    uVar73 = uStack_1230;
    uStack_122c = local_1218._12_4_;
    uVar75 = uStack_122c;
    do {
      if (pRVar29 == (RayK<4> *)0x0) break;
      pRVar25 = (RayK<4> *)0xffffffff;
      if ((ulong)*(uint *)(pRVar29 + lVar31 + 0x10) == 0xffffffff) break;
      fVar40 = *(float *)(pRVar29 + lVar31 + -0x80);
      fVar70 = *(float *)(pRVar29 + lVar31 + -0x70);
      fVar72 = *(float *)(pRVar29 + lVar31 + -0x60);
      local_1078._0_4_ = (float)uVar26;
      local_1078._4_4_ = (float)((ulong)uVar26 >> 0x20);
      uStack_1070._0_4_ = (float)uVar8;
      uStack_1070._4_4_ = (float)((ulong)uVar8 >> 0x20);
      local_1078._0_4_ = fVar40 - (float)local_1078;
      local_1078._4_4_ = fVar40 - local_1078._4_4_;
      uStack_1070._0_4_ = fVar40 - (float)uStack_1070;
      fVar40 = fVar40 - uStack_1070._4_4_;
      local_1088._0_4_ = (float)uVar9;
      local_1088._4_4_ = (float)((ulong)uVar9 >> 0x20);
      uStack_1080._0_4_ = (float)uVar10;
      uStack_1080._4_4_ = (float)((ulong)uVar10 >> 0x20);
      local_1088._0_4_ = fVar70 - (float)local_1088;
      local_1088._4_4_ = fVar70 - local_1088._4_4_;
      uStack_1080._0_4_ = fVar70 - (float)uStack_1080;
      fVar70 = fVar70 - uStack_1080._4_4_;
      local_1098._0_4_ = (float)uVar11;
      local_1098._4_4_ = (float)((ulong)uVar11 >> 0x20);
      uStack_1090._0_4_ = (float)uVar12;
      uStack_1090._4_4_ = (float)((ulong)uVar12 >> 0x20);
      local_1098._0_4_ = fVar72 - (float)local_1098;
      local_1098._4_4_ = fVar72 - local_1098._4_4_;
      uStack_1090._0_4_ = fVar72 - (float)uStack_1090;
      fVar72 = fVar72 - uStack_1090._4_4_;
      fVar74 = *(float *)(pRVar29 + lVar31 + -0x50);
      fVar76 = *(float *)(pRVar29 + lVar31 + -0x40);
      fVar84 = *(float *)(pRVar29 + lVar31 + -0x30);
      fVar87 = *(float *)(pRVar29 + lVar31 + -0x20);
      fVar90 = *(float *)(pRVar29 + lVar31 + -0x10);
      local_1058 = ZEXT416((uint)fVar90);
      fVar93 = *(float *)(pRVar29 + lVar31);
      local_1068 = ZEXT416((uint)fVar93);
      local_10d8 = fVar84 * fVar90 - fVar76 * fVar93;
      local_10c8 = fVar93 * fVar74 - fVar84 * fVar87;
      local_10e8 = fVar87 * fVar76 - fVar90 * fVar74;
      local_11c8 = (float)*(undefined8 *)(ray + 0x50);
      fStack_11c4 = (float)((ulong)*(undefined8 *)(ray + 0x50) >> 0x20);
      fStack_11c0 = (float)*(undefined8 *)(ray + 0x58);
      fStack_11bc = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_1148 = (float)*(undefined8 *)(ray + 0x60);
      fStack_1144 = (float)((ulong)*(undefined8 *)(ray + 0x60) >> 0x20);
      fStack_1140 = (float)*(undefined8 *)(ray + 0x68);
      fStack_113c = (float)((ulong)*(undefined8 *)(ray + 0x68) >> 0x20);
      fVar152 = (float)local_1088 * local_1148 - (float)local_1098 * local_11c8;
      fVar153 = local_1088._4_4_ * fStack_1144 - local_1098._4_4_ * fStack_11c4;
      fVar154 = (float)uStack_1080 * fStack_1140 - (float)uStack_1090 * fStack_11c0;
      fVar155 = fVar70 * fStack_113c - fVar72 * fStack_11bc;
      local_10a8._0_4_ = (float)uVar15;
      local_10a8._4_4_ = (float)((ulong)uVar15 >> 0x20);
      uStack_10a0._0_4_ = (float)uVar16;
      uStack_10a0._4_4_ = (float)((ulong)uVar16 >> 0x20);
      fVar119 = (float)local_1098 * (float)local_10a8 - (float)local_1078 * local_1148;
      fVar126 = local_1098._4_4_ * local_10a8._4_4_ - local_1078._4_4_ * fStack_1144;
      fVar130 = (float)uStack_1090 * (float)uStack_10a0 - (float)uStack_1070 * fStack_1140;
      fVar131 = fVar72 * uStack_10a0._4_4_ - fVar40 * fStack_113c;
      fVar95 = (float)local_1078 * local_11c8 - (float)local_1088 * (float)local_10a8;
      fVar109 = local_1078._4_4_ * fStack_11c4 - local_1088._4_4_ * local_10a8._4_4_;
      fVar112 = (float)uStack_1070 * fStack_11c0 - (float)uStack_1080 * (float)uStack_10a0;
      fVar118 = fVar40 * fStack_11bc - fVar70 * uStack_10a0._4_4_;
      fStack_10e4 = local_10e8;
      fStack_10e0 = local_10e8;
      fStack_10dc = local_10e8;
      fStack_10c4 = local_10c8;
      fStack_10c0 = local_10c8;
      fStack_10bc = local_10c8;
      fStack_10d4 = local_10d8;
      fStack_10d0 = local_10d8;
      fStack_10cc = local_10d8;
      fVar132 = local_10d8 * (float)local_10a8 + local_10c8 * local_11c8 + local_10e8 * local_1148;
      fVar141 = local_10d8 * local_10a8._4_4_ + local_10c8 * fStack_11c4 + local_10e8 * fStack_1144;
      fVar145 = local_10d8 * (float)uStack_10a0 +
                local_10c8 * fStack_11c0 + local_10e8 * fStack_1140;
      fVar146 = local_10d8 * uStack_10a0._4_4_ + local_10c8 * fStack_11bc + local_10e8 * fStack_113c
      ;
      uVar77 = (uint)fVar132 & 0x80000000;
      uVar78 = (uint)fVar141 & 0x80000000;
      uVar85 = (uint)fVar145 & 0x80000000;
      uVar86 = (uint)fVar146 & 0x80000000;
      fVar107 = (float)((uint)(fVar87 * fVar152 + fVar90 * fVar119 + fVar93 * fVar95) ^ uVar77);
      fVar111 = (float)((uint)(fVar87 * fVar153 + fVar90 * fVar126 + fVar93 * fVar109) ^ uVar78);
      fVar117 = (float)((uint)(fVar87 * fVar154 + fVar90 * fVar130 + fVar93 * fVar112) ^ uVar85);
      fVar87 = (float)((uint)(fVar87 * fVar155 + fVar90 * fVar131 + fVar93 * fVar118) ^ uVar86);
      auVar65._0_4_ = -(uint)(0.0 <= fVar107) & local_1238;
      auVar65._4_4_ = -(uint)(0.0 <= fVar111) & uStack_1234;
      auVar65._8_4_ = -(uint)(0.0 <= fVar117) & uStack_1230;
      auVar65._12_4_ = -(uint)(0.0 <= fVar87) & uStack_122c;
      iVar24 = movmskps(0xffffffff,auVar65);
      auVar67._8_8_ = mm_lookupmask_ps._8_8_;
      auVar67._0_8_ = mm_lookupmask_ps._0_8_;
      if (iVar24 != 0) {
        fVar90 = (float)((uint)(fVar74 * fVar152 + fVar76 * fVar119 + fVar84 * fVar95) ^ uVar77);
        fVar93 = (float)((uint)(fVar74 * fVar153 + fVar76 * fVar126 + fVar84 * fVar109) ^ uVar78);
        fVar95 = (float)((uint)(fVar74 * fVar154 + fVar76 * fVar130 + fVar84 * fVar112) ^ uVar85);
        fVar74 = (float)((uint)(fVar74 * fVar155 + fVar76 * fVar131 + fVar84 * fVar118) ^ uVar86);
        auVar116._0_4_ = -(uint)(0.0 <= fVar90) & auVar65._0_4_;
        auVar116._4_4_ = -(uint)(0.0 <= fVar93) & auVar65._4_4_;
        auVar116._8_4_ = -(uint)(0.0 <= fVar95) & auVar65._8_4_;
        auVar116._12_4_ = -(uint)(0.0 <= fVar74) & auVar65._12_4_;
        iVar24 = movmskps(iVar24,auVar116);
        if (iVar24 != 0) {
          fVar76 = ABS(fVar132);
          fVar84 = ABS(fVar141);
          fVar109 = ABS(fVar145);
          fVar112 = ABS(fVar146);
          auVar68._0_4_ = -(uint)(fVar90 <= fVar76 - fVar107) & auVar116._0_4_;
          auVar68._4_4_ = -(uint)(fVar93 <= fVar84 - fVar111) & auVar116._4_4_;
          auVar68._8_4_ = -(uint)(fVar95 <= fVar109 - fVar117) & auVar116._8_4_;
          auVar68._12_4_ = -(uint)(fVar74 <= fVar112 - fVar87) & auVar116._12_4_;
          iVar24 = movmskps(iVar24,auVar68);
          if (iVar24 != 0) {
            fVar74 = (float)(uVar77 ^ (uint)((float)local_1078 * local_10d8 +
                                            (float)local_1088 * local_10c8 +
                                            local_10e8 * (float)local_1098));
            fVar87 = (float)(uVar78 ^ (uint)(local_1078._4_4_ * local_10d8 +
                                            local_1088._4_4_ * local_10c8 +
                                            local_10e8 * local_1098._4_4_));
            fVar90 = (float)(uVar85 ^ (uint)((float)uStack_1070 * local_10d8 +
                                            (float)uStack_1080 * local_10c8 +
                                            local_10e8 * (float)uStack_1090));
            fVar40 = (float)(uVar86 ^ (uint)(fVar40 * local_10d8 +
                                            fVar70 * local_10c8 + local_10e8 * fVar72));
            local_10f8._0_4_ = (float)uVar13;
            local_10f8._4_4_ = (float)((ulong)uVar13 >> 0x20);
            uStack_10f0._0_4_ = (float)uVar14;
            uStack_10f0._4_4_ = (float)((ulong)uVar14 >> 0x20);
            local_1108._0_4_ = (float)uVar17;
            local_1108._4_4_ = (float)((ulong)uVar17 >> 0x20);
            uStack_1100._0_4_ = (float)uVar18;
            uStack_1100._4_4_ = (float)((ulong)uVar18 >> 0x20);
            auVar129._0_4_ =
                 -(uint)(fVar74 <= fVar76 * (float)local_1108 && fVar76 * (float)local_10f8 < fVar74
                        ) & auVar68._0_4_;
            auVar129._4_4_ =
                 -(uint)(fVar87 <= fVar84 * local_1108._4_4_ && fVar84 * local_10f8._4_4_ < fVar87)
                 & auVar68._4_4_;
            auVar129._8_4_ =
                 -(uint)(fVar90 <= fVar109 * (float)uStack_1100 &&
                        fVar109 * (float)uStack_10f0 < fVar90) & auVar68._8_4_;
            auVar129._12_4_ =
                 -(uint)(fVar40 <= fVar112 * uStack_1100._4_4_ &&
                        fVar112 * uStack_10f0._4_4_ < fVar40) & auVar68._12_4_;
            iVar24 = movmskps(iVar24,auVar129);
            if (iVar24 != 0) {
              auVar151._0_8_ =
                   CONCAT44(-(uint)(fVar141 != 0.0) & auVar129._4_4_,
                            -(uint)(fVar132 != 0.0) & auVar129._0_4_);
              auVar151._8_4_ = -(uint)(fVar145 != 0.0) & auVar129._8_4_;
              auVar151._12_4_ = -(uint)(fVar146 != 0.0) & auVar129._12_4_;
              iVar24 = movmskps(iVar24,auVar151);
              auVar67._8_4_ = auVar151._8_4_;
              auVar67._0_8_ = auVar151._0_8_;
              auVar67._12_4_ = auVar151._12_4_;
              if (iVar24 == 0) {
                auVar67._0_8_ = mm_lookupmask_ps._0_8_;
              }
            }
          }
        }
      }
      pGVar5 = (context->scene->geometries).items[*(uint *)(pRVar29 + lVar31 + 0x10)].ptr;
      uVar77 = pGVar5->mask;
      local_10b8._0_4_ = (uint)uVar19;
      local_10b8._4_4_ = (uint)((ulong)uVar19 >> 0x20);
      uStack_10b0._0_4_ = (uint)uVar20;
      uStack_10b0._4_4_ = (uint)((ulong)uVar20 >> 0x20);
      auVar66._0_4_ = -(uint)((uVar77 & (uint)local_10b8) == 0);
      auVar66._4_4_ = -(uint)((uVar77 & local_10b8._4_4_) == 0);
      auVar66._8_4_ = -(uint)((uVar77 & (uint)uStack_10b0) == 0);
      auVar66._12_4_ = -(uint)((uVar77 & uStack_10b0._4_4_) == 0);
      auVar67 = ~auVar66 & auVar67;
      iVar24 = movmskps((int)pGVar5,auVar67);
      if (iVar24 != 0) {
        local_1238 = ~auVar67._0_4_ & local_1238;
        uStack_1234 = ~auVar67._4_4_ & uStack_1234;
        uStack_1230 = ~auVar67._8_4_ & uStack_1230;
        uStack_122c = ~auVar67._12_4_ & uStack_122c;
      }
      auVar21._4_4_ = uStack_1234;
      auVar21._0_4_ = local_1238;
      auVar21._8_4_ = uStack_1230;
      auVar21._12_4_ = uStack_122c;
      iVar24 = movmskps(iVar24,auVar21);
      pRVar25 = (RayK<4> *)CONCAT44((int)((ulong)pGVar5 >> 0x20),iVar24);
      pRVar29 = pRVar29 + 4;
    } while (iVar24 != 0);
    local_1218._0_4_ = uVar22 & local_1238;
    local_1218._4_4_ = uVar71 & uStack_1234;
    local_1218._8_4_ = uVar73 & uStack_1230;
    local_1218._12_4_ = uVar75 & uStack_122c;
    iVar24 = movmskps((int)pRVar25,local_1218);
    pRVar25 = (RayK<4> *)CONCAT44((int)((ulong)pRVar25 >> 0x20),iVar24);
    lVar34 = lVar34 + 1;
    lVar31 = lVar31 + 0xb0;
  } while (iVar24 != 0);
  auVar83._0_8_ = local_1218._0_8_ ^ 0xffffffffffffffff;
  auVar83._8_4_ = local_1218._8_4_ ^ 0xffffffff;
  auVar83._12_4_ = local_1218._12_4_ ^ 0xffffffff;
  local_1268 = local_1268 | auVar83;
  local_1208._0_4_ = ~local_1268._0_4_ & local_1208._0_4_;
  local_1208._4_4_ = ~local_1268._4_4_ & local_1208._4_4_;
  local_1208._8_4_ = ~local_1268._8_4_ & local_1208._8_4_;
  local_1208._12_4_ = ~local_1268._12_4_ & local_1208._12_4_;
  iVar24 = movmskps((int)pRVar25,local_1208);
  uVar26 = CONCAT44((int)((ulong)pRVar25 >> 0x20),iVar24);
  if (iVar24 == 0) goto LAB_006e991e;
  auVar124 = blendvps(auVar124,_DAT_01f45a40,local_1268);
  goto LAB_006e9246;
LAB_006e991e:
  if (uVar28 == 0) {
    auVar69._0_4_ = -(uint)(local_1128 == -1);
    auVar69._4_4_ = -(uint)(iStack_1124 == -1);
    auVar69._8_4_ = -(uint)(iStack_1120 == -1);
    auVar69._12_4_ = -(uint)(iStack_111c == -1);
    auVar79 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f45a40,auVar69 & local_1268);
    *(undefined1 (*) [16])(ray + 0x80) = auVar79;
    return;
  }
  goto LAB_006e8e55;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occludedCoherent(vint<K>* __restrict__ valid_i,
                                                                                                      Accel::Intersectors* __restrict__ This,
                                                                                                      RayK<K>& __restrict__ ray,
                                                                                                      RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid,ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      vbool<K> terminated = !valid;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      do
      {
        const size_t valid_index = bsf(valid_bits);
        vbool<K> octant_valid = octant[valid_index] == octant;
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar,  vfloat<K>(neg_inf));

        Frustum<robust> frustum;
        frustum.template init<K>(octant_valid, tray.org, tray.rdir, tray.tnear, tray.tfar, N);

        StackItemMaskT<NodeRef> stack[stackSizeSingle];  // stack of nodes
        StackItemMaskT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
        stack[0].ptr  = bvh->root;
        stack[0].mask = movemask(octant_valid);

        while (1) pop:
        {
          /* pop next node from stack */
          if (unlikely(stackPtr == stack)) break;

          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* cull node of active rays have already been terminated */
          size_t m_active = (size_t)stackPtr->mask & (~(size_t)movemask(terminated));

          if (unlikely(m_active == 0)) continue;

          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            //STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const AABBNode* __restrict__ const node = nodeRef.getAABBNode();

            vfloat<N> fmin;
            size_t m_frustum_node = intersectNodeFrustum<N>(node, frustum, fmin);

            if (unlikely(!m_frustum_node)) goto pop;
            cur = BVH::emptyNode;
            m_active = 0;

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[popcnt(m_frustum_node)], 1, 1, 1);
#endif
            //size_t num_child_hits = 0;
            do {
              const size_t i = bscf(m_frustum_node);
              vfloat<K> lnearP;
              vbool<K> lhit = false; // motion blur is not supported, so the initial value will be ignored
              STAT3(normal.trav_nodes, 1, 1, 1);
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              if (likely(any(lhit)))
              {                                
                const NodeRef child = node->child(i);
                assert(child != BVH::emptyNode);
                BVHN<N>::prefetch(child);
                if (likely(cur != BVH::emptyNode)) {
                  //num_child_hits++;
                  stackPtr->ptr  = cur;
                  stackPtr->mask = m_active;
                  stackPtr++;
                }
                cur = child;
                m_active = movemask(lhit);
              }
            } while(m_frustum_node);

            if (unlikely(cur == BVH::emptyNode)) goto pop;
          }

          /* intersect leaf */
          assert(cur != BVH::invalidNode);
          assert(cur != BVH::emptyNode);
#if defined(__AVX__)
          STAT3(normal.trav_leaves, 1, popcnt(m_active), K);
#endif
          if (unlikely(!m_active)) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
          octant_valid &= !terminated;
          if (unlikely(none(octant_valid))) break;
          tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

          if (unlikely(lazy_node)) {
            stackPtr->ptr  = lazy_node;
            stackPtr->mask = movemask(octant_valid);
            stackPtr++;
          }
        }
      } while(valid_bits);

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }